

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O1

bool __thiscall
QOpenGLTextureBlitterPrivate::ensureProgram(QOpenGLTextureBlitterPrivate *this,ProgramIndex idx)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  char *fs;
  char *vs;
  ProgramIndex idx_00;
  QOpenGLTextureBlitter *this_00;
  long in_FS_OFFSET;
  QSurfaceFormat format;
  QOpenGLTextureBlitter local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  if (this->programs[idx].glProgram.d != (QOpenGLShaderProgram *)0x0) goto LAB_0015ed19;
  lVar3 = QOpenGLContext::currentContext();
  if (lVar3 == 0) {
    bVar1 = false;
    goto LAB_0015ed19;
  }
  this_00 = &local_30;
  local_30.d_ptr.d =
       (QScopedPointer<QOpenGLTextureBlitterPrivate,_QScopedPointerDeleter<QOpenGLTextureBlitterPrivate>_>
        )&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  iVar2 = QSurfaceFormat::profile();
  if (iVar2 == 1) {
    this_00 = &local_30;
    uVar4 = QSurfaceFormat::version();
    if (((int)uVar4 < 3) || ((int)((ulong)uVar4 >> 0x20) < 2 && (int)uVar4 == 3)) goto LAB_0015ec9b;
    if ((idx == TEXTURE_RECTANGLE) &&
       (bVar1 = QOpenGLTextureBlitter::supportsRectangleTarget(this_00), bVar1)) {
      vs = 
      "#version 150 core\nin vec3 vertexCoord;in vec2 textureCoord;out vec2 uv;uniform mat4 vertexTransform;uniform mat3 textureTransform;void main() {   uv = (textureTransform * vec3(textureCoord,1.0)).xy;   gl_Position = vertexTransform * vec4(vertexCoord,1.0);}"
      ;
      fs = 
      "#version 150 core\nin vec2 uv;out vec4 fragcolor;uniform sampler2DRect textureSampler;uniform bool swizzle;uniform float opacity;void main() {   vec4 tmpFragColor = texture(textureSampler, uv);   tmpFragColor.a *= opacity;   fragcolor = swizzle ? tmpFragColor.bgra : tmpFragColor;}"
      ;
      idx_00 = TEXTURE_RECTANGLE;
LAB_0015ecf1:
      bVar1 = buildProgram(this,idx_00,vs,fs);
      if (!bVar1) goto LAB_0015ed37;
    }
LAB_0015ecfa:
    bVar1 = this->programs[idx].glProgram.d != (QOpenGLShaderProgram *)0x0;
  }
  else {
LAB_0015ec9b:
    if (idx == TEXTURE_EXTERNAL_OES) {
      bVar1 = QOpenGLTextureBlitter::supportsExternalOESTarget(this_00);
      if (bVar1) {
        vs = 
        "attribute highp vec3 vertexCoord;attribute highp vec2 textureCoord;varying highp vec2 uv;uniform highp mat4 vertexTransform;uniform highp mat3 textureTransform;void main() {   uv = (textureTransform * vec3(textureCoord,1.0)).xy;   gl_Position = vertexTransform * vec4(vertexCoord,1.0);}"
        ;
        fs = 
        "#extension GL_OES_EGL_image_external : require\nvarying highp vec2 uv;uniform samplerExternalOES textureSampler;\nuniform bool swizzle;uniform highp float opacity;void main() {   highp vec4 tmpFragColor = texture2D(textureSampler, uv);   tmpFragColor.a *= opacity;   gl_FragColor = swizzle ? tmpFragColor.bgra : tmpFragColor;}"
        ;
        idx_00 = TEXTURE_EXTERNAL_OES;
        goto LAB_0015ecf1;
      }
      goto LAB_0015ecfa;
    }
    if (((idx != TEXTURE_RECTANGLE) ||
        (bVar1 = QOpenGLTextureBlitter::supportsRectangleTarget(this_00), !bVar1)) ||
       (bVar1 = buildProgram(this,TEXTURE_RECTANGLE,
                             "attribute highp vec3 vertexCoord;attribute highp vec2 textureCoord;varying highp vec2 uv;uniform highp mat4 vertexTransform;uniform highp mat3 textureTransform;void main() {   uv = (textureTransform * vec3(textureCoord,1.0)).xy;   gl_Position = vertexTransform * vec4(vertexCoord,1.0);}"
                             ,
                             "varying highp vec2 uv;uniform sampler2DRect textureSampler;uniform bool swizzle;uniform highp float opacity;void main() {   highp vec4 tmpFragColor = texture2DRect(textureSampler,uv);   tmpFragColor.a *= opacity;   gl_FragColor = swizzle ? tmpFragColor.bgra : tmpFragColor;}"
                            ), bVar1)) goto LAB_0015ecfa;
LAB_0015ed37:
    bVar1 = false;
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
LAB_0015ed19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTextureBlitterPrivate::ensureProgram(ProgramIndex idx)
{
    if (programs[idx].glProgram)
        return true;

    QOpenGLContext *currentContext = QOpenGLContext::currentContext();
    if (!currentContext)
        return false;

    QSurfaceFormat format = currentContext->format();
    if (format.profile() == QSurfaceFormat::CoreProfile && format.version() >= std::pair(3,2)) {
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_RECTANGLE && q->supportsRectangleTarget()) {
            if (!buildProgram(idx, vertex_shader150, fragment_shader150_rectangle))
                return false;
        }
    } else {
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_RECTANGLE && q->supportsRectangleTarget()) {
            if (!buildProgram(idx, vertex_shader, fragment_shader_rectangle))
                return false;
        }
        if (idx == QOpenGLTextureBlitterPrivate::TEXTURE_EXTERNAL_OES && q->supportsExternalOESTarget()) {
            if (!buildProgram(idx, vertex_shader, fragment_shader_external_oes))
                return false;
        }
    }

    return !programs[idx].glProgram.isNull();
}